

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwIsOwned(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  int iVar2;
  mwStat *pmVar3;
  byte bVar4;
  mwStat *ms;
  int retv;
  int line_local;
  char *file_local;
  mwData *mw_local;
  
  iVar2 = mwIsSafeAddr(mw,mwDataSize);
  if (iVar2 == 0) {
    mw_local._4_4_ = 0;
  }
  else if (((mwHead == (mwData *)0x0) && (mwTail == (mwData *)0x0)) && (mwStatCurAlloc == 0)) {
    mw_local._4_4_ = 0;
  }
  else if (mw->check == (mw->count ^ 0xfe0180U ^ mw->size ^ (long)mw->line)) {
    if ((mw->prev != (mwData *)0x0) && (iVar2 = mwIsSafeAddr(mw->prev,mwDataSize), iVar2 == 0)) {
      mwRelink(mw,file,line);
    }
    if ((mw->next != (mwData *)0x0) && (iVar2 = mwIsSafeAddr(mw->next,mwDataSize), iVar2 == 0)) {
      mwRelink(mw,file,line);
    }
    pmVar1 = mwHead;
    if (mw->prev != (mwData *)0x0) {
      pmVar1 = mw->prev->next;
    }
    bVar4 = pmVar1 == mw;
    if (mw->next == (mwData *)0x0) {
      if (mwTail == mw) {
        bVar4 = bVar4 + 1;
      }
    }
    else if (mw->next->prev == mw) {
      bVar4 = bVar4 + 1;
    }
    if (mw->check == (mw->count ^ 0xfe0180U ^ mw->size ^ (long)mw->line)) {
      bVar4 = bVar4 + 1;
    }
    if (bVar4 < 3) {
      iVar2 = mwIsHeapOK(mw);
      if ((iVar2 == 0) && (iVar2 = mwRelink(mw,file,line), iVar2 != 0)) {
        mw_local._4_4_ = 1;
      }
      else {
        mwWrite("internal: <%ld> %s(%d), mwIsOwned fails for MW-%p\n",mwCounter,file,
                (ulong)(uint)line,mw);
        mwIncErr();
        mw_local._4_4_ = 0;
      }
    }
    else {
      mw_local._4_4_ = 1;
    }
  }
  else {
    iVar2 = mwIsHeapOK(mw);
    if (iVar2 == 0) {
      mw_local._4_4_ = 0;
    }
    else {
      mwWrite("internal: <%ld> %s(%d), checksum for MW-%p is incorrect\n",mwCounter,file,
              (ulong)(uint)line,mw);
      mwIncErr();
      iVar2 = mwIsReadAddr(mw->file,1);
      if (iVar2 == 0) {
        mw->file = "<unknown>";
      }
      else {
        pmVar3 = mwStatGet(mw->file,-1,0);
        if (pmVar3 == (mwStat *)0x0) {
          mw->file = "<relinked>";
        }
      }
      mw->size = 0;
      mw->check = mw->count ^ 0xfe0180U ^ mw->size ^ (long)mw->line;
      mw_local._4_4_ = 1;
    }
  }
  return mw_local._4_4_;
}

Assistant:

static int mwIsOwned(mwData *mw, const char *file, int line)
{
	int retv;
	mwStat *ms;

	/* see if the address is legal according to OS */
	if (!mwIsSafeAddr(mw, mwDataSize)) {
		return 0;
	}

	/* make sure we have _anything_ allocated */
	if (mwHead == NULL && mwTail == NULL && mwStatCurAlloc == 0) {
		return 0;
	}

	/* calculate checksum */
	if (mw->check != CHKVAL(mw)) {
		/* may be damaged checksum, see if block is in heap */
		if (mwIsHeapOK(mw)) {
			/* damaged checksum, repair it */
			mwWrite("internal: <%ld> %s(%d), checksum for MW-%p is incorrect\n",
					mwCounter, file, line, mw);
			mwIncErr();
			if (mwIsReadAddr(mw->file, 1)) {
				ms = mwStatGet(mw->file, -1, 0);
				if (ms == NULL) {
					mw->file = "<relinked>";
				}
			} else {
				mw->file = "<unknown>";
			}
			mw->size = 0;
			mw->check = CHKVAL(mw);
			return 1;
		}
		/* no, it's just some garbage data */
		return 0;
	}

	/* check that the non-NULL pointers are safe */
	if (mw->prev && !mwIsSafeAddr(mw->prev, mwDataSize)) {
		mwRelink(mw, file, line);
	}
	if (mw->next && !mwIsSafeAddr(mw->next, mwDataSize)) {
		mwRelink(mw, file, line);
	}

	/* safe address, checksum OK, proceed with heap checks */

	/* see if the block is in the heap */
	retv = 0;
	if (mw->prev) {
		if (mw->prev->next == mw) {
			retv ++;
		}
	} else {
		if (mwHead == mw) {
			retv++;
		}
	}
	if (mw->next) {
		if (mw->next->prev == mw) {
			retv ++;
		}
	} else {
		if (mwTail == mw) {
			retv++;
		}
	}
	if (mw->check == CHKVAL(mw)) {
		retv ++;
	}
	if (retv > 2) {
		return 1;
	}

	/* block not in heap, check heap for corruption */

	if (!mwIsHeapOK(mw)) {
		if (mwRelink(mw, file, line)) {
			return 1;
		}
	}

	/* unable to repair */
	mwWrite("internal: <%ld> %s(%d), mwIsOwned fails for MW-%p\n",
			mwCounter, file, line, mw);
	mwIncErr();

	return 0;
}